

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttrigon.c
# Opt level: O3

FT_Fixed FT_Tan(FT_Angle angle)

{
  ulong uVar1;
  ulong uVar2;
  FT_Vector v;
  FT_Vector local_18;
  
  local_18.x = 0x1000000;
  local_18.y = 0;
  ft_trig_pseudo_rotate(&local_18,angle);
  if (local_18.x == 0) {
    uVar1 = 0x7fffffff;
  }
  else {
    uVar1 = -local_18.x;
    if (0 < local_18.x) {
      uVar1 = local_18.x;
    }
    uVar2 = -local_18.y;
    if (0 < local_18.y) {
      uVar2 = local_18.y;
    }
    uVar1 = ((uVar1 >> 1) + uVar2 * 0x10000) / uVar1;
  }
  uVar2 = -uVar1;
  if (-1 < (local_18.x ^ local_18.y)) {
    uVar2 = uVar1;
  }
  return uVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Fixed )
  FT_Tan( FT_Angle  angle )
  {
    FT_Vector  v = { 1 << 24, 0 };


    ft_trig_pseudo_rotate( &v, angle );

    return FT_DivFix( v.y, v.x );
  }